

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O0

void anon_unknown.dwarf_eb2ac::writeReadMultiPart
               (char *fileName,int width,int height,Array2D<Imf_2_5::Rgba> *p1)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  Rgba *pRVar6;
  Header *this;
  Box2i *sizeX;
  Box2i *this_00;
  Array2D<Imf_2_5::Rgba> *in_RCX;
  int in_ESI;
  char *in_RDI;
  float fVar7;
  float fVar8;
  int x_1;
  int y_1;
  InputPart p_2;
  int part_1;
  FrameBuffer f_2;
  Array2D<Imf_2_5::Rgba> p2_1;
  int dy_1;
  int dx_1;
  int h_1;
  int w_1;
  Box2i *dw_1;
  MultiPartInputFile in_1;
  MMIFStream ifs_1;
  int x;
  int y;
  InputPart p_1;
  int part;
  FrameBuffer f_1;
  Array2D<Imf_2_5::Rgba> p2;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  MultiPartInputFile in;
  StdIFStream ifs;
  ifstream is;
  OutputPart p;
  int i;
  FrameBuffer f;
  MultiPartOutputFile out;
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> headers;
  StdOFStream ofs;
  ofstream os;
  undefined4 in_stack_fffffffffffff4c8;
  undefined4 uVar9;
  int scanLine2;
  int in_stack_fffffffffffff4cc;
  undefined4 in_stack_fffffffffffff4d0;
  undefined4 uVar10;
  int in_stack_fffffffffffff4d4;
  undefined4 in_stack_fffffffffffff4d8;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff4dc;
  StdIFStream *in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4ec;
  float in_stack_fffffffffffff4f0;
  float in_stack_fffffffffffff4f4;
  allocator<char> *in_stack_fffffffffffff500;
  string *in_stack_fffffffffffff508;
  LineOrder in_stack_fffffffffffff510;
  float in_stack_fffffffffffff514;
  V2f *in_stack_fffffffffffff518;
  Array2D<Imf_2_5::Rgba> *in_stack_fffffffffffff520;
  Header *in_stack_fffffffffffff528;
  Header *in_stack_fffffffffffff530;
  int local_9d0;
  int local_9cc;
  int local_9bc;
  string *in_stack_fffffffffffff658;
  Header *in_stack_fffffffffffff660;
  undefined1 in_stack_fffffffffffff6b3;
  int in_stack_fffffffffffff6b4;
  IStream *in_stack_fffffffffffff6b8;
  MultiPartInputFile *in_stack_fffffffffffff6c0;
  int in_stack_fffffffffffff6f4;
  undefined1 in_stack_fffffffffffff6fb;
  int in_stack_fffffffffffff6fc;
  Header *in_stack_fffffffffffff700;
  OStream *in_stack_fffffffffffff708;
  MultiPartOutputFile *in_stack_fffffffffffff710;
  char *in_stack_fffffffffffff718;
  MMIFStream *in_stack_fffffffffffff720;
  Array2D<Imf_2_5::Rgba> local_8a8;
  undefined4 in_stack_fffffffffffff770;
  int iVar12;
  undefined4 in_stack_fffffffffffff774;
  undefined4 in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff77c;
  FrameBuffer *in_stack_fffffffffffff780;
  int local_828;
  int local_824;
  int local_814;
  Slice local_810;
  Slice local_7d8;
  Slice local_7a0;
  Slice local_768;
  Array2D<Imf_2_5::Rgba> local_700;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  Box2i *local_6d8;
  undefined1 local_688 [532];
  int local_474;
  Slice local_470;
  Slice local_438;
  Slice local_400;
  Slice local_3c8 [2];
  allocator<char> local_349;
  string local_348 [36];
  Channel local_324;
  Channel local_314;
  Channel local_304;
  Channel local_2f4;
  allocator<char> local_2e1;
  string local_2e0 [32];
  Vec2<float> local_2c0 [9];
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> local_278 [4];
  undefined1 local_218 [512];
  Array2D<Imf_2_5::Rgba> *local_18;
  int local_c;
  char *local_8;
  
  local_18 = in_RCX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"scan-line based mulitpart file:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"writing");
  remove(local_8);
  std::ofstream::ofstream(local_218);
  std::operator|(_S_out,_S_bin);
  testutil::OpenStreamWithUTF8Name<std::ofstream>
            ((basic_ofstream<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             (char *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
             ~(_S_ios_openmode_min|_S_ios_openmode_max));
  Imf_2_5::StdOFStream::StdOFStream
            ((StdOFStream *)in_stack_fffffffffffff4e0,
             (ofstream *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8),
             (char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
  std::allocator<Imf_2_5::Header>::allocator((allocator<Imf_2_5::Header> *)0x1a39c1);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
             CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
             CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
             (allocator_type *)in_stack_fffffffffffff4e0);
  std::allocator<Imf_2_5::Header>::~allocator((allocator<Imf_2_5::Header> *)0x1a39ea);
  Imath_2_5::Vec2<float>::Vec2(local_2c0,0.0,0.0);
  Imf_2_5::Header::Header
            (in_stack_fffffffffffff530,(int)((ulong)in_stack_fffffffffffff528 >> 0x20),
             (int)in_stack_fffffffffffff528,(float)((ulong)in_stack_fffffffffffff520 >> 0x20),
             in_stack_fffffffffffff518,in_stack_fffffffffffff514,in_stack_fffffffffffff510,
             (Compression)((ulong)in_stack_fffffffffffff508 >> 0x20));
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,0);
  Imf_2_5::Header::operator=(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  Imf_2_5::Header::~Header((Header *)in_stack_fffffffffffff4e0);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             (char *)in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  Imf_2_5::Header::setName
            ((Header *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             in_stack_fffffffffffff508);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,0);
  Imf_2_5::Header::channels((Header *)0x1a3b1a);
  Imf_2_5::Channel::Channel(&local_2f4,HALF,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Channel *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,0);
  Imf_2_5::Header::channels((Header *)0x1a3b76);
  Imf_2_5::Channel::Channel(&local_304,HALF,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Channel *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,0);
  Imf_2_5::Header::channels((Header *)0x1a3bd2);
  Imf_2_5::Channel::Channel(&local_314,HALF,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Channel *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,0);
  Imf_2_5::Header::channels((Header *)0x1a3c2e);
  Imf_2_5::Channel::Channel(&local_324,HALF,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Channel *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,0);
  Imf_2_5::Header::setType(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,0);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,1);
  Imf_2_5::Header::operator=(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             (char *)in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  Imf_2_5::Header::setName
            ((Header *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             in_stack_fffffffffffff508);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::operator[](local_278,0);
  Imf_2_5::globalThreadCount();
  Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
            (in_stack_fffffffffffff710,in_stack_fffffffffffff708,in_stack_fffffffffffff700,
             in_stack_fffffffffffff6fc,(bool)in_stack_fffffffffffff6fb,in_stack_fffffffffffff6f4);
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1a3db9);
  pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,0);
  Imf_2_5::Slice::Slice(local_3c8,HALF,(char *)pRVar6,8,(long)local_c << 3,1,1,0.0,false,false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Slice *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,0);
  Imf_2_5::Slice::Slice(&local_400,HALF,(char *)&pRVar6->g,8,(long)local_c << 3,1,1,0.0,false,false)
  ;
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Slice *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,0);
  Imf_2_5::Slice::Slice(&local_438,HALF,(char *)&pRVar6->b,8,(long)local_c << 3,1,1,0.0,false,false)
  ;
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Slice *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,0);
  uVar11 = 0;
  uVar10 = 0;
  uVar9 = 1;
  Imf_2_5::Slice::Slice(&local_470,HALF,(char *)&pRVar6->a,8,(long)local_c << 3,1,1,0.0,false,false)
  ;
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Slice *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  for (local_474 = 0; local_474 < 2; local_474 = local_474 + 1) {
    Imf_2_5::OutputPart::OutputPart
              ((OutputPart *)in_stack_fffffffffffff4e0,
               (MultiPartOutputFile *)CONCAT44(in_stack_fffffffffffff4dc,uVar11),
               in_stack_fffffffffffff4d4);
    Imf_2_5::OutputPart::setFrameBuffer
              ((OutputPart *)CONCAT44(in_stack_fffffffffffff4d4,uVar10),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffff4cc,uVar9));
    Imf_2_5::OutputPart::writePixels
              ((OutputPart *)CONCAT44(in_stack_fffffffffffff4d4,uVar10),in_stack_fffffffffffff4cc);
  }
  Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1a4162);
  Imf_2_5::MultiPartOutputFile::~MultiPartOutputFile
            ((MultiPartOutputFile *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)in_stack_fffffffffffff4e0)
  ;
  Imf_2_5::StdOFStream::~StdOFStream((StdOFStream *)CONCAT44(in_stack_fffffffffffff4d4,uVar10));
  std::ofstream::~ofstream(local_218);
  std::operator<<((ostream *)&std::cout,", reading");
  std::ifstream::ifstream(local_688);
  std::operator|(_S_in,_S_bin);
  testutil::OpenStreamWithUTF8Name<std::ifstream>
            ((basic_ifstream<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffff4d4,uVar10),
             (char *)CONCAT44(in_stack_fffffffffffff4cc,uVar9),
             ~(_S_ios_openmode_min|_S_ios_openmode_max));
  Imf_2_5::StdIFStream::StdIFStream
            (in_stack_fffffffffffff4e0,(ifstream *)CONCAT44(in_stack_fffffffffffff4dc,uVar11),
             (char *)CONCAT44(in_stack_fffffffffffff4d4,uVar10));
  Imf_2_5::globalThreadCount();
  Imf_2_5::MultiPartInputFile::MultiPartInputFile
            (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b4,
             (bool)in_stack_fffffffffffff6b3);
  iVar2 = Imf_2_5::MultiPartInputFile::parts((MultiPartInputFile *)0x1a4253);
  if (iVar2 != 2) {
    __assert_fail("in.parts() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                  ,0x171,
                  "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                 );
  }
  Imf_2_5::MultiPartInputFile::header
            ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff4d4,uVar10),
             in_stack_fffffffffffff4cc);
  Imf_2_5::Header::dataWindow((Header *)0x1a4329);
  Imf_2_5::MultiPartInputFile::header
            ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff4d4,uVar10),
             in_stack_fffffffffffff4cc);
  Imf_2_5::Header::dataWindow((Header *)0x1a435c);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffff4e0,
                     (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff4dc,uVar11));
  if (!bVar1) {
    __assert_fail("in.header(0).dataWindow()==in.header(1).dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                  ,0x173,
                  "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                 );
  }
  Imf_2_5::MultiPartInputFile::header
            ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff4d4,uVar10),
             in_stack_fffffffffffff4cc);
  local_6d8 = Imf_2_5::Header::dataWindow((Header *)0x1a43d8);
  local_6dc = ((local_6d8->max).x - (local_6d8->min).x) + 1;
  local_6e0 = ((local_6d8->max).y - (local_6d8->min).y) + 1;
  local_6e4 = (local_6d8->min).x;
  local_6e8 = (local_6d8->min).y;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D
            (in_stack_fffffffffffff520,(long)in_stack_fffffffffffff518,
             CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510));
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1a4472);
  pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_700,(long)-local_6e8);
  Imf_2_5::Slice::Slice
            (&local_768,HALF,(char *)(pRVar6 + -local_6e4),8,(long)local_6dc << 3,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Slice *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_700,(long)-local_6e8);
  Imf_2_5::Slice::Slice
            (&local_7a0,HALF,(char *)&pRVar6[-local_6e4].g,8,(long)local_6dc << 3,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Slice *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_700,(long)-local_6e8);
  Imf_2_5::Slice::Slice
            (&local_7d8,HALF,(char *)&pRVar6[-local_6e4].b,8,(long)local_6dc << 3,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Slice *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_700,(long)-local_6e8);
  uVar10 = 0;
  uVar9 = 0;
  iVar2 = 1;
  Imf_2_5::Slice::Slice
            (&local_810,HALF,(char *)&pRVar6[-local_6e4].a,8,(long)local_6dc << 3,1,1,0.0,false,
             false);
  Imf_2_5::FrameBuffer::insert
            (in_stack_fffffffffffff780,
             (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (Slice *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  local_814 = 0;
  do {
    if (1 < local_814) {
      Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1a4a61);
      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D
                ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_fffffffffffff4d4,uVar9));
      Imf_2_5::MultiPartInputFile::~MultiPartInputFile
                ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0)
                );
      Imf_2_5::StdIFStream::~StdIFStream((StdIFStream *)CONCAT44(in_stack_fffffffffffff4d4,uVar9));
      std::ifstream::~ifstream(local_688);
      std::operator<<((ostream *)&std::cout,", reading (memory-mapped)");
      MMIFStream::MMIFStream(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
      Imf_2_5::globalThreadCount();
      Imf_2_5::MultiPartInputFile::MultiPartInputFile
                (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b4,
                 (bool)in_stack_fffffffffffff6b3);
      iVar2 = Imf_2_5::MultiPartInputFile::parts((MultiPartInputFile *)0x1a4af5);
      if (iVar2 != 2) {
        __assert_fail("in.parts() == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                      ,0x19b,
                      "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                     );
      }
      Imf_2_5::MultiPartInputFile::header
                ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff4d4,uVar9),
                 in_stack_fffffffffffff4cc);
      Imf_2_5::Header::dataWindow((Header *)0x1a4ba3);
      this = Imf_2_5::MultiPartInputFile::header
                       ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff4d4,uVar9),
                        in_stack_fffffffffffff4cc);
      sizeX = Imf_2_5::Header::dataWindow((Header *)0x1a4bcd);
      bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                        ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffff4e0,
                         (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffff4dc,uVar10));
      uVar10 = CONCAT13(bVar1,SUB43(in_stack_fffffffffffff514,0));
      if (!bVar1) {
        __assert_fail("in.header(0).dataWindow()==in.header(1).dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                      ,0x19d,
                      "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                     );
      }
      Imf_2_5::MultiPartInputFile::header
                ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff4d4,uVar9),
                 in_stack_fffffffffffff4cc);
      this_00 = Imf_2_5::Header::dataWindow((Header *)0x1a4c34);
      iVar3 = ((this_00->max).x - (this_00->min).x) + 1;
      iVar4 = ((this_00->max).y - (this_00->min).y) + 1;
      iVar2 = (this_00->min).x;
      iVar12 = (this_00->min).y;
      Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D
                ((Array2D<Imf_2_5::Rgba> *)this,(long)sizeX,
                 CONCAT44(uVar10,in_stack_fffffffffffff510));
      Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1a4cc8);
      pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_8a8,(long)-iVar12);
      Imf_2_5::Slice::Slice
                ((Slice *)&stack0xfffffffffffff6f0,HALF,(char *)(pRVar6 + -iVar2),8,(long)iVar3 << 3
                 ,1,1,0.0,false,false);
      Imf_2_5::FrameBuffer::insert
                ((FrameBuffer *)this_00,(char *)CONCAT44(iVar3,iVar4),
                 (Slice *)CONCAT44(iVar2,iVar12));
      pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_8a8,(long)-iVar12);
      Imf_2_5::Slice::Slice
                ((Slice *)&stack0xfffffffffffff6b8,HALF,(char *)&pRVar6[-iVar2].g,8,(long)iVar3 << 3
                 ,1,1,0.0,false,false);
      Imf_2_5::FrameBuffer::insert
                ((FrameBuffer *)this_00,(char *)CONCAT44(iVar3,iVar4),
                 (Slice *)CONCAT44(iVar2,iVar12));
      pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_8a8,(long)-iVar12);
      Imf_2_5::Slice::Slice
                ((Slice *)&stack0xfffffffffffff680,HALF,(char *)&pRVar6[-iVar2].b,8,(long)iVar3 << 3
                 ,1,1,0.0,false,false);
      Imf_2_5::FrameBuffer::insert
                ((FrameBuffer *)this_00,(char *)CONCAT44(iVar3,iVar4),
                 (Slice *)CONCAT44(iVar2,iVar12));
      pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_8a8,(long)-iVar12);
      uVar10 = 0;
      uVar9 = 0;
      scanLine2 = 1;
      Imf_2_5::Slice::Slice
                ((Slice *)&stack0xfffffffffffff648,HALF,(char *)&pRVar6[-iVar2].a,8,(long)iVar3 << 3
                 ,1,1,0.0,false,false);
      Imf_2_5::FrameBuffer::insert
                ((FrameBuffer *)this_00,(char *)CONCAT44(iVar3,iVar4),
                 (Slice *)CONCAT44(iVar2,iVar12));
      local_9bc = 0;
      do {
        if (1 < local_9bc) {
          Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1a52a5);
          Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D
                    ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_fffffffffffff4d4,uVar9));
          Imf_2_5::MultiPartInputFile::~MultiPartInputFile
                    ((MultiPartInputFile *)
                     CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0));
          MMIFStream::~MMIFStream((MMIFStream *)CONCAT44(in_stack_fffffffffffff4d4,uVar9));
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          remove(local_8);
          return;
        }
        Imf_2_5::InputPart::InputPart
                  ((InputPart *)in_stack_fffffffffffff4e0,
                   (MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff4dc,uVar10),
                   in_stack_fffffffffffff4d4);
        Imf_2_5::InputPart::setFrameBuffer
                  ((InputPart *)CONCAT44(in_stack_fffffffffffff4d4,uVar9),
                   (FrameBuffer *)CONCAT44(in_stack_fffffffffffff4cc,scanLine2));
        Imf_2_5::InputPart::readPixels
                  ((InputPart *)CONCAT44(in_stack_fffffffffffff4d4,uVar9),in_stack_fffffffffffff4cc,
                   scanLine2);
        poVar5 = std::operator<<((ostream *)&std::cout,", comparing pt ");
        std::ostream::operator<<(poVar5,local_9bc);
        for (local_9cc = 0; local_9cc < iVar4; local_9cc = local_9cc + 1) {
          for (local_9d0 = 0; local_9d0 < iVar3; local_9d0 = local_9d0 + 1) {
            pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_8a8,(long)local_9cc);
            in_stack_fffffffffffff4f4 = half::operator_cast_to_float(&pRVar6[local_9d0].r);
            pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,(long)local_9cc);
            fVar7 = half::operator_cast_to_float(&pRVar6[local_9d0].r);
            if ((in_stack_fffffffffffff4f4 != fVar7) ||
               (NAN(in_stack_fffffffffffff4f4) || NAN(fVar7))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                            ,0x1b8,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                           );
            }
            pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_8a8,(long)local_9cc);
            in_stack_fffffffffffff4f0 = half::operator_cast_to_float(&pRVar6[local_9d0].g);
            pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,(long)local_9cc);
            fVar7 = half::operator_cast_to_float(&pRVar6[local_9d0].g);
            if ((in_stack_fffffffffffff4f0 != fVar7) ||
               (NAN(in_stack_fffffffffffff4f0) || NAN(fVar7))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                            ,0x1b9,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                           );
            }
            pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_8a8,(long)local_9cc);
            fVar7 = half::operator_cast_to_float(&pRVar6[local_9d0].b);
            pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,(long)local_9cc);
            fVar8 = half::operator_cast_to_float(&pRVar6[local_9d0].b);
            if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                            ,0x1ba,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                           );
            }
            pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_8a8,(long)local_9cc);
            fVar7 = half::operator_cast_to_float(&pRVar6[local_9d0].a);
            pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,(long)local_9cc);
            fVar8 = half::operator_cast_to_float(&pRVar6[local_9d0].a);
            if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                            ,0x1bb,
                            "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                           );
            }
          }
        }
        local_9bc = local_9bc + 1;
      } while( true );
    }
    Imf_2_5::InputPart::InputPart
              ((InputPart *)in_stack_fffffffffffff4e0,
               (MultiPartInputFile *)CONCAT44(in_stack_fffffffffffff4dc,uVar10),
               in_stack_fffffffffffff4d4);
    Imf_2_5::InputPart::setFrameBuffer
              ((InputPart *)CONCAT44(in_stack_fffffffffffff4d4,uVar9),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffff4cc,iVar2));
    Imf_2_5::InputPart::readPixels
              ((InputPart *)CONCAT44(in_stack_fffffffffffff4d4,uVar9),in_stack_fffffffffffff4cc,
               iVar2);
    poVar5 = std::operator<<((ostream *)&std::cout,", comparing pt ");
    std::ostream::operator<<(poVar5,local_814);
    for (local_824 = 0; local_824 < local_6e0; local_824 = local_824 + 1) {
      for (local_828 = 0; local_828 < local_6dc; local_828 = local_828 + 1) {
        pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_700,(long)local_824);
        fVar7 = half::operator_cast_to_float(&pRVar6[local_828].r);
        pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,(long)local_824);
        fVar8 = half::operator_cast_to_float(&pRVar6[local_828].r);
        if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
          __assert_fail("p2[y][x].r == p1[y][x].r",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                        ,0x18d,
                        "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                       );
        }
        pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_700,(long)local_824);
        fVar7 = half::operator_cast_to_float(&pRVar6[local_828].g);
        pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,(long)local_824);
        fVar8 = half::operator_cast_to_float(&pRVar6[local_828].g);
        if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
          __assert_fail("p2[y][x].g == p1[y][x].g",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                        ,0x18e,
                        "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                       );
        }
        pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_700,(long)local_824);
        fVar7 = half::operator_cast_to_float(&pRVar6[local_828].b);
        pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,(long)local_824);
        fVar8 = half::operator_cast_to_float(&pRVar6[local_828].b);
        if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
          __assert_fail("p2[y][x].b == p1[y][x].b",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                        ,399,
                        "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                       );
        }
        pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_700,(long)local_824);
        fVar7 = half::operator_cast_to_float(&pRVar6[local_828].a);
        pRVar6 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_18,(long)local_824);
        fVar8 = half::operator_cast_to_float(&pRVar6[local_828].a);
        if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
          __assert_fail("p2[y][x].a == p1[y][x].a",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testExistingStreams.cpp"
                        ,400,
                        "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, const Array2D<Rgba> &)"
                       );
        }
      }
    }
    local_814 = local_814 + 1;
  } while( true );
}

Assistant:

void
writeReadMultiPart (const char fileName[],
                    int width,
                    int height,
                    const Array2D<Rgba> &p1)
{
    //
    // Save a two scanline parts in an image, but instead of
    // letting the MultiPartOutputFile object open the file,
    // make the MultiPartOutputFile object use an existing
    // StdOFStream.  Read the image back, using an
    // existing StdIFStream, and compare the pixels
    // with the original data.  Then read the image
    // back a second time using a memory-mapped
    // MMIFStream (see above).
    //
                        
    cout << "scan-line based mulitpart file:" << endl;
                            
    {
        cout << "writing";
        remove (fileName);
        std::ofstream os;
        testutil::OpenStreamWithUTF8Name (
            os, fileName, ios::out | ios_base::binary);
        StdOFStream ofs (os, fileName);

        vector<Header> headers(2);
        headers[0] = Header(width, height);
        headers[0].setName("part1");
        headers[0].channels().insert("R",Channel());
        headers[0].channels().insert("G",Channel());
        headers[0].channels().insert("B",Channel());
        headers[0].channels().insert("A",Channel());
        headers[0].setType(SCANLINEIMAGE);

        headers[1]=headers[0];
        headers[1].setName("part2");

        MultiPartOutputFile out (ofs, &headers[0],2);
        FrameBuffer f;
        f.insert("R",Slice(HALF,(char *) &p1[0][0].r,sizeof(Rgba),width*sizeof(Rgba)));
        f.insert("G",Slice(HALF,(char *) &p1[0][0].g,sizeof(Rgba),width*sizeof(Rgba)));
        f.insert("B",Slice(HALF,(char *) &p1[0][0].b,sizeof(Rgba),width*sizeof(Rgba)));
        f.insert("A",Slice(HALF,(char *) &p1[0][0].a,sizeof(Rgba),width*sizeof(Rgba)));
        
        for(int i=0;i<2;i++)
        {
            OutputPart p(out,i);
            p.setFrameBuffer (f);
            p.writePixels (height);
        }
    }
                        
    {
        cout << ", reading";
        std::ifstream is;
        testutil::OpenStreamWithUTF8Name (
            is, fileName, ios::in | ios_base::binary);
        StdIFStream ifs (is, fileName);
        MultiPartInputFile in (ifs);
        
        assert(in.parts() == 2);
        
        assert(in.header(0).dataWindow()==in.header(1).dataWindow());
        
        const Box2i &dw = in.header(0).dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dx = dw.min.x;
        int dy = dw.min.y;
        
        Array2D<Rgba> p2 (h, w);
        FrameBuffer f;
        f.insert("R",Slice(HALF,(char *) &p2[-dy][-dx].r,sizeof(Rgba),w*sizeof(Rgba)));
        f.insert("G",Slice(HALF,(char *) &p2[-dy][-dx].g,sizeof(Rgba),w*sizeof(Rgba)));
        f.insert("B",Slice(HALF,(char *) &p2[-dy][-dx].b,sizeof(Rgba),w*sizeof(Rgba)));
        f.insert("A",Slice(HALF,(char *) &p2[-dy][-dx].a,sizeof(Rgba),w*sizeof(Rgba)));
        
        for(int part=0;part<2;part++)
        {
            InputPart p(in,part);
            p.setFrameBuffer(f);
            p.readPixels (dw.min.y, dw.max.y);
                            
            cout << ", comparing pt " << part;
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {
                    assert (p2[y][x].r == p1[y][x].r);
                    assert (p2[y][x].g == p1[y][x].g);
                    assert (p2[y][x].b == p1[y][x].b);
                    assert (p2[y][x].a == p1[y][x].a);
                }
            }
        }
    }
    
    {
        cout << ", reading (memory-mapped)";
        MMIFStream ifs (fileName);
        MultiPartInputFile in (ifs);
        
        assert(in.parts() == 2);
        
        assert(in.header(0).dataWindow()==in.header(1).dataWindow());
        
        
        const Box2i &dw = in.header(0).dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dx = dw.min.x;
        int dy = dw.min.y;
        
        Array2D<Rgba> p2 (h, w);
        FrameBuffer f;
        f.insert("R",Slice(HALF,(char *) &p2[-dy][-dx].r,sizeof(Rgba),w*sizeof(Rgba)));
        f.insert("G",Slice(HALF,(char *) &p2[-dy][-dx].g,sizeof(Rgba),w*sizeof(Rgba)));
        f.insert("B",Slice(HALF,(char *) &p2[-dy][-dx].b,sizeof(Rgba),w*sizeof(Rgba)));
        f.insert("A",Slice(HALF,(char *) &p2[-dy][-dx].a,sizeof(Rgba),w*sizeof(Rgba)));
        
        for(int part=0;part<2;part++)
        {
            InputPart p(in,part);
            p.setFrameBuffer(f);
            p.readPixels (dw.min.y, dw.max.y);
            
            cout << ", comparing pt " << part;
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {
                    assert (p2[y][x].r == p1[y][x].r);
                    assert (p2[y][x].g == p1[y][x].g);
                    assert (p2[y][x].b == p1[y][x].b);
                    assert (p2[y][x].a == p1[y][x].a);
                }
            }
        }
    }
    
    cout << endl;
                        
    remove (fileName);
}